

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bnll_x86.cpp
# Opt level: O0

int __thiscall ncnn::BNLL_x86::forward_inplace(BNLL_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  long *in_RSI;
  float fVar8;
  ulong uVar9;
  float fVar14;
  ulong uVar10;
  double dVar11;
  float fVar15;
  ulong uVar16;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar18;
  ulong uVar17;
  int iVar19;
  __m128 _x;
  __m128 _tmp;
  __m128 _abs_p;
  __m128 mask;
  __m128 _p;
  __m128 _zero;
  __m128 _one;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  Mat *m;
  v4sf y_1;
  v4sf z;
  v4sf tmp_1;
  v4sf mask_2;
  v4sf e;
  v4sf invalid_mask;
  v4sf one_1;
  v4si emm0_1;
  v4sf pow2n;
  v4sf y;
  v4sf mask_1;
  v4sf one;
  v4si emm0;
  v4sf fx;
  v4sf tmp;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  undefined8 local_1058;
  undefined8 uStack_1050;
  int local_1028;
  undefined8 local_1018;
  undefined8 local_1010;
  undefined8 local_1008;
  undefined4 local_1000;
  long local_ff8;
  undefined4 local_ff0;
  undefined4 local_fec;
  undefined4 local_fe8;
  undefined4 local_fe4;
  undefined4 local_fe0;
  undefined8 local_fd8;
  float *local_fd0;
  int local_fc4;
  int local_fc0;
  int local_fbc;
  int local_fb8;
  int local_fb4;
  int local_fb0;
  int local_fac;
  long *local_fa0;
  undefined1 local_f8d;
  int local_f8c;
  undefined8 *local_f80;
  undefined8 *local_f78;
  undefined8 *local_f68;
  undefined4 local_f58;
  undefined4 uStack_f54;
  undefined4 uStack_f50;
  undefined4 uStack_f4c;
  undefined4 local_f3c;
  undefined8 local_f38;
  undefined8 uStack_f30;
  float *local_f20;
  undefined8 local_f18;
  undefined8 uStack_f10;
  undefined8 local_f08;
  undefined8 uStack_f00;
  ulong local_ef8;
  ulong uStack_ef0;
  ulong local_ee8;
  ulong uStack_ee0;
  int local_ed8 [2];
  int aiStack_ed0 [2];
  ulong local_ec8;
  ulong uStack_ec0;
  undefined8 local_eb8;
  undefined8 uStack_eb0;
  float local_ea8;
  float fStack_ea4;
  float fStack_ea0;
  float fStack_e9c;
  ulong local_e98;
  ulong uStack_e90;
  int local_e88;
  int iStack_e84;
  int iStack_e80;
  int iStack_e7c;
  float local_e78;
  float fStack_e74;
  float fStack_e70;
  float fStack_e6c;
  int local_e68;
  int iStack_e64;
  int iStack_e60;
  int iStack_e5c;
  undefined8 local_e58;
  undefined8 uStack_e50;
  int local_e48;
  int iStack_e44;
  int iStack_e40;
  int iStack_e3c;
  undefined8 local_e38;
  undefined8 uStack_e30;
  undefined8 local_e28;
  undefined8 uStack_e20;
  ulong local_e18;
  ulong uStack_e10;
  undefined8 local_e08;
  undefined8 uStack_e00;
  ulong local_df8;
  ulong uStack_df0;
  ulong local_de8;
  ulong uStack_de0;
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  ulong local_dc8;
  ulong uStack_dc0;
  undefined8 local_db8;
  undefined8 uStack_db0;
  undefined8 local_da8;
  undefined8 uStack_da0;
  undefined8 local_d98;
  undefined8 uStack_d90;
  undefined8 local_d88;
  undefined8 uStack_d80;
  undefined8 local_d78;
  undefined8 uStack_d70;
  undefined8 local_d68;
  undefined8 uStack_d60;
  undefined8 local_d58;
  undefined8 uStack_d50;
  float local_d48;
  float fStack_d44;
  float fStack_d40;
  float fStack_d3c;
  undefined8 local_d38;
  undefined8 uStack_d30;
  undefined8 local_d28;
  undefined8 uStack_d20;
  undefined8 local_d18;
  undefined8 uStack_d10;
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  undefined8 local_ce8;
  undefined8 uStack_ce0;
  float local_cd8;
  float fStack_cd4;
  float fStack_cd0;
  float fStack_ccc;
  float local_cc8;
  float fStack_cc4;
  float fStack_cc0;
  float fStack_cbc;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined8 local_c78;
  undefined8 uStack_c70;
  undefined8 local_c68;
  undefined8 uStack_c60;
  ulong local_c58;
  ulong uStack_c50;
  undefined8 local_c48;
  undefined8 uStack_c40;
  undefined8 local_c38;
  undefined8 uStack_c30;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  ulong local_bb8;
  ulong uStack_bb0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  float *local_b70;
  long local_b68;
  undefined4 local_b5c;
  long local_b58;
  float *local_b50;
  undefined4 local_b44;
  int local_b40;
  int local_b3c;
  undefined8 *local_b38;
  undefined4 local_b2c;
  long local_b28;
  undefined8 *local_b08;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined4 local_a6c;
  undefined8 local_a68;
  undefined8 uStack_a60;
  ulong local_a58;
  ulong uStack_a50;
  ulong local_a48;
  ulong uStack_a40;
  ulong local_a38;
  ulong uStack_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  ulong local_a18;
  ulong uStack_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  float local_8a8;
  float fStack_8a4;
  float fStack_8a0;
  float fStack_89c;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  float local_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  float local_7c8;
  float fStack_7c4;
  float fStack_7c0;
  float fStack_7bc;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  float local_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  float local_6e8;
  float fStack_6e4;
  float fStack_6e0;
  float fStack_6dc;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  float local_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  float local_608;
  float fStack_604;
  float fStack_600;
  float fStack_5fc;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  float local_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  float local_528;
  float fStack_524;
  float fStack_520;
  float fStack_51c;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  float local_448;
  float fStack_444;
  float fStack_440;
  float fStack_43c;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_fac = *(int *)((long)in_RSI + 0x2c);
  local_fb0 = (int)in_RSI[6];
  local_fb4 = *(int *)((long)in_RSI + 0x34);
  local_fb8 = (int)in_RSI[7];
  local_fbc = (int)in_RSI[3];
  local_fc0 = local_fac * local_fb0 * local_fb4 * local_fbc;
  local_fa0 = in_RSI;
  for (local_fc4 = 0; local_fc4 < local_fb8; local_fc4 = local_fc4 + 1) {
    local_f80 = &local_1018;
    local_b3c = *(int *)((long)local_fa0 + 0x2c);
    local_b40 = (int)local_fa0[6];
    local_b44 = *(undefined4 *)((long)local_fa0 + 0x34);
    local_b50 = (float *)(*local_fa0 + local_fa0[8] * (long)local_fc4 * local_fa0[2]);
    local_b58 = local_fa0[2];
    local_b5c = (undefined4)local_fa0[3];
    local_b68 = local_fa0[4];
    local_b38 = &local_1018;
    local_b28 = (long)local_b3c * (long)local_b40 * local_b58;
    local_f78 = &local_1018;
    local_f68 = &local_1018;
    local_b2c = 0x10;
    local_f8c = local_fc4;
    local_f8d = 1;
    local_1018 = 0;
    local_1008 = 0;
    local_1000 = 0;
    local_ff0 = 0;
    local_fec = 0;
    local_fe8 = 0;
    local_fe4 = 0;
    local_fe0 = 0;
    local_fd8 = 0;
    local_1010 = 0;
    local_f3c = 0x3f800000;
    local_f58 = 0x3f800000;
    uStack_f54 = 0x3f800000;
    uStack_f50 = 0x3f800000;
    uStack_f4c = 0x3f800000;
    local_f38 = 0;
    uStack_f30 = 0;
    local_fd0 = local_b50;
    for (local_1028 = 0; local_b08 = local_f68, local_ff8 = local_b68, local_1028 + 3 < local_fc0;
        local_1028 = local_1028 + 4) {
      local_f20 = local_fd0;
      local_ee8 = *(ulong *)local_fd0;
      uStack_ee0 = *(ulong *)(local_fd0 + 2);
      local_f18 = 0;
      uStack_f10 = 0;
      local_f08._0_4_ = (float)local_ee8;
      local_f08._4_4_ = (float)(local_ee8 >> 0x20);
      uStack_f00._0_4_ = (float)uStack_ee0;
      uStack_f00._4_4_ = (float)(uStack_ee0 >> 0x20);
      local_ed8[0] = 0x7fffffff;
      local_ed8[1] = 0x7fffffff;
      aiStack_ed0[0] = 0x7fffffff;
      aiStack_ed0[1] = 0x7fffffff;
      uVar9 = local_ee8 & 0x7fffffff7fffffff;
      uVar16 = uStack_ee0 & 0x7fffffff7fffffff;
      local_b98 = 0;
      uStack_b90 = 0;
      local_ba8._0_4_ = (float)uVar9;
      local_ba8._4_4_ = (float)(uVar9 >> 0x20);
      uStack_ba0._0_4_ = (float)uVar16;
      uStack_ba0._4_4_ = (float)(uVar16 >> 0x20);
      local_ca8 = CONCAT44(0.0 - local_ba8._4_4_,0.0 - (float)local_ba8);
      uStack_ca0._0_4_ = 0.0 - (float)uStack_ba0;
      uStack_ca0._4_4_ = 0.0 - uStack_ba0._4_4_;
      local_c98 = 0;
      uStack_c90 = 0;
      local_e58 = 0x3f8000003f800000;
      uStack_e50 = 0x3f8000003f800000;
      local_88 = local_ca8;
      uStack_80 = uStack_ca0;
      local_98 = 0x42b0c0a542b0c0a5;
      uStack_90 = 0x42b0c0a542b0c0a5;
      auVar7._8_8_ = uStack_ca0;
      auVar7._0_8_ = local_ca8;
      auVar6._8_8_ = 0x42b0c0a542b0c0a5;
      auVar6._0_8_ = 0x42b0c0a542b0c0a5;
      auVar12 = minps(auVar7,auVar6);
      local_ca8 = auVar12._0_8_;
      local_aa8 = local_ca8;
      uStack_ca0 = auVar12._8_8_;
      uStack_aa0 = uStack_ca0;
      local_ab8 = 0xc2b0c0a5c2b0c0a5;
      uStack_ab0 = 0xc2b0c0a5c2b0c0a5;
      auVar13._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar13._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar13 = maxps(auVar12,auVar13);
      local_ca8 = auVar13._0_8_;
      uVar1 = local_ca8;
      uStack_ca0 = auVar13._8_8_;
      uVar2 = uStack_ca0;
      local_968 = 0x3fb8aa3b3fb8aa3b;
      uStack_960 = 0x3fb8aa3b3fb8aa3b;
      local_958._0_4_ = auVar13._0_4_;
      local_958._4_4_ = auVar13._4_4_;
      uStack_950._0_4_ = auVar13._8_4_;
      uStack_950._4_4_ = auVar13._12_4_;
      local_c18 = CONCAT44(local_958._4_4_ * 1.442695,(float)local_958 * 1.442695);
      uStack_c10 = CONCAT44(uStack_950._4_4_ * 1.442695,(float)uStack_950 * 1.442695);
      local_c28 = 0x3f0000003f000000;
      uStack_c20 = 0x3f0000003f000000;
      fVar8 = (float)local_958 * 1.442695 + 0.5;
      fVar14 = local_958._4_4_ * 1.442695 + 0.5;
      fVar15 = (float)uStack_950 * 1.442695 + 0.5;
      fVar18 = uStack_950._4_4_ * 1.442695 + 0.5;
      local_68 = CONCAT44(fVar14,fVar8);
      uStack_60 = CONCAT44(fVar18,fVar15);
      local_9e8 = CONCAT44((int)fVar14,(int)fVar8);
      uStack_9e0 = CONCAT44((int)fVar18,(int)fVar15);
      local_cc8 = (float)(int)fVar8;
      fStack_cc4 = (float)(int)fVar14;
      fStack_cc0 = (float)(int)fVar15;
      fStack_cbc = (float)(int)fVar18;
      local_cb8 = CONCAT44(fStack_cc4,local_cc8);
      uStack_cb0 = CONCAT44(fStack_cbc,fStack_cc0);
      local_c78 = local_cb8;
      uStack_c70 = uStack_cb0;
      local_c88 = CONCAT44(fVar14,fVar8);
      uStack_c80 = CONCAT44(fVar18,fVar15);
      local_cf8 = CONCAT44(-(uint)(fVar14 < fStack_cc4),-(uint)(fVar8 < local_cc8));
      uStack_cf0 = CONCAT44(-(uint)(fVar18 < fStack_cbc),-(uint)(fVar15 < fStack_cc0));
      local_c58 = local_cf8;
      uStack_c50 = uStack_cf0;
      local_c68 = 0x3f8000003f800000;
      uStack_c60 = 0x3f8000003f800000;
      local_cf8 = local_cf8 & 0x3f8000003f800000;
      uStack_cf0 = uStack_cf0 & 0x3f8000003f800000;
      local_bf8 = local_cb8;
      uStack_bf0 = uStack_cb0;
      local_c08._0_4_ = (float)local_cf8;
      local_c08._4_4_ = (float)(local_cf8 >> 0x20);
      uStack_c00._0_4_ = (float)uStack_cf0;
      uStack_c00._4_4_ = (float)(uStack_cf0 >> 0x20);
      local_cc8 = local_cc8 - (float)local_c08;
      fStack_cc4 = fStack_cc4 - local_c08._4_4_;
      fStack_cc0 = fStack_cc0 - (float)uStack_c00;
      fStack_cbc = fStack_cbc - uStack_c00._4_4_;
      local_158 = CONCAT44(fStack_cc4,local_cc8);
      uStack_150 = CONCAT44(fStack_cbc,fStack_cc0);
      local_178 = local_ca8;
      uStack_170 = uStack_ca0;
      local_638 = 0x3f3180003f318000;
      uStack_630 = 0x3f3180003f318000;
      local_138 = local_ca8;
      uStack_130 = uStack_ca0;
      local_128 = 0x3f3180003f318000;
      uStack_120 = 0x3f3180003f318000;
      local_148 = local_cc8 * 0.6933594;
      fStack_144 = fStack_cc4 * 0.6933594;
      fStack_140 = fStack_cc0 * 0.6933594;
      fStack_13c = fStack_cbc * 0.6933594;
      local_ca8 = CONCAT44(local_958._4_4_ - fStack_144,(float)local_958 - local_148);
      uStack_ca0._0_4_ = (float)uStack_950 - fStack_140;
      uStack_ca0._4_4_ = uStack_950._4_4_ - fStack_13c;
      local_1c8 = CONCAT44(fStack_cc4,local_cc8);
      uStack_1c0 = CONCAT44(fStack_cbc,fStack_cc0);
      local_1e8 = local_ca8;
      uStack_1e0 = uStack_ca0;
      local_5c8 = 0xb95e8083b95e8083;
      uStack_5c0 = 0xb95e8083b95e8083;
      local_1a8 = local_ca8;
      uStack_1a0 = uStack_ca0;
      local_198 = 0xb95e8083b95e8083;
      uStack_190 = 0xb95e8083b95e8083;
      local_1b8 = local_cc8 * -0.00021219444;
      fStack_1b4 = fStack_cc4 * -0.00021219444;
      fStack_1b0 = fStack_cc0 * -0.00021219444;
      fStack_1ac = fStack_cbc * -0.00021219444;
      fVar8 = ((float)local_958 - local_148) - local_1b8;
      fVar14 = (local_958._4_4_ - fStack_144) - fStack_1b4;
      fVar15 = ((float)uStack_950 - fStack_140) - fStack_1b0;
      fVar18 = (uStack_950._4_4_ - fStack_13c) - fStack_1ac;
      local_ca8 = CONCAT44(fVar14,fVar8);
      uStack_ca0._0_4_ = fVar15;
      uStack_ca0._4_4_ = fVar18;
      local_988 = local_ca8;
      uStack_980 = uStack_ca0;
      local_cb8 = CONCAT44(fVar14 * fVar14,fVar8 * fVar8);
      uStack_cb0 = CONCAT44(fVar18 * fVar18,fVar15 * fVar15);
      local_698 = 0x3950696739506967;
      uStack_690 = 0x3950696739506967;
      local_6a8 = local_ca8;
      uStack_6a0 = uStack_ca0;
      local_6b8 = 0x3ab743ce3ab743ce;
      uStack_6b0 = 0x3ab743ce3ab743ce;
      local_658 = 0x3950696739506967;
      uStack_650 = 0x3950696739506967;
      local_668 = local_ca8;
      uStack_660 = uStack_ca0;
      local_678 = fVar8 * 0.00019875691;
      fStack_674 = fVar14 * 0.00019875691;
      fStack_670 = fVar15 * 0.00019875691;
      fStack_66c = fVar18 * 0.00019875691;
      local_688 = 0x3ab743ce3ab743ce;
      uStack_680 = 0x3ab743ce3ab743ce;
      local_d08 = CONCAT44(fStack_674 + 0.0013981999,local_678 + 0.0013981999);
      uStack_d00 = CONCAT44(fStack_66c + 0.0013981999,fStack_670 + 0.0013981999);
      local_708 = local_d08;
      uStack_700 = uStack_d00;
      local_718 = local_ca8;
      uStack_710 = uStack_ca0;
      local_728 = 0x3c0889083c088908;
      uStack_720 = 0x3c0889083c088908;
      local_6c8 = local_d08;
      uStack_6c0 = uStack_d00;
      local_6d8 = local_ca8;
      uStack_6d0 = uStack_ca0;
      local_6e8 = (local_678 + 0.0013981999) * fVar8;
      fStack_6e4 = (fStack_674 + 0.0013981999) * fVar14;
      fStack_6e0 = (fStack_670 + 0.0013981999) * fVar15;
      fStack_6dc = (fStack_66c + 0.0013981999) * fVar18;
      local_6f8 = 0x3c0889083c088908;
      uStack_6f0 = 0x3c0889083c088908;
      local_d08 = CONCAT44(fStack_6e4 + 0.008333452,local_6e8 + 0.008333452);
      uStack_d00 = CONCAT44(fStack_6dc + 0.008333452,fStack_6e0 + 0.008333452);
      local_778 = local_d08;
      uStack_770 = uStack_d00;
      local_788 = local_ca8;
      uStack_780 = uStack_ca0;
      local_798 = 0x3d2aa9c13d2aa9c1;
      uStack_790 = 0x3d2aa9c13d2aa9c1;
      local_738 = local_d08;
      uStack_730 = uStack_d00;
      local_748 = local_ca8;
      uStack_740 = uStack_ca0;
      local_758 = (local_6e8 + 0.008333452) * fVar8;
      fStack_754 = (fStack_6e4 + 0.008333452) * fVar14;
      fStack_750 = (fStack_6e0 + 0.008333452) * fVar15;
      fStack_74c = (fStack_6dc + 0.008333452) * fVar18;
      local_768 = 0x3d2aa9c13d2aa9c1;
      uStack_760 = 0x3d2aa9c13d2aa9c1;
      local_d08 = CONCAT44(fStack_754 + 0.041665796,local_758 + 0.041665796);
      uStack_d00 = CONCAT44(fStack_74c + 0.041665796,fStack_750 + 0.041665796);
      local_7e8 = local_d08;
      uStack_7e0 = uStack_d00;
      local_7f8 = local_ca8;
      uStack_7f0 = uStack_ca0;
      local_808 = 0x3e2aaaaa3e2aaaaa;
      uStack_800 = 0x3e2aaaaa3e2aaaaa;
      local_7a8 = local_d08;
      uStack_7a0 = uStack_d00;
      local_7b8 = local_ca8;
      uStack_7b0 = uStack_ca0;
      local_7c8 = (local_758 + 0.041665796) * fVar8;
      fStack_7c4 = (fStack_754 + 0.041665796) * fVar14;
      fStack_7c0 = (fStack_750 + 0.041665796) * fVar15;
      fStack_7bc = (fStack_74c + 0.041665796) * fVar18;
      local_7d8 = 0x3e2aaaaa3e2aaaaa;
      uStack_7d0 = 0x3e2aaaaa3e2aaaaa;
      local_d08 = CONCAT44(fStack_7c4 + 0.16666666,local_7c8 + 0.16666666);
      uStack_d00 = CONCAT44(fStack_7bc + 0.16666666,fStack_7c0 + 0.16666666);
      local_858 = local_d08;
      uStack_850 = uStack_d00;
      local_868 = local_ca8;
      uStack_860 = uStack_ca0;
      local_818 = local_d08;
      uStack_810 = uStack_d00;
      local_828 = local_ca8;
      uStack_820 = uStack_ca0;
      local_838 = (local_7c8 + 0.16666666) * fVar8;
      fStack_834 = (fStack_7c4 + 0.16666666) * fVar14;
      fStack_830 = (fStack_7c0 + 0.16666666) * fVar15;
      fStack_82c = (fStack_7bc + 0.16666666) * fVar18;
      local_848 = 0x3f0000003f000000;
      uStack_840 = 0x3f0000003f000000;
      local_d08 = CONCAT44(fStack_834 + 0.5,local_838 + 0.5);
      uStack_d00 = CONCAT44(fStack_82c + 0.5,fStack_830 + 0.5);
      local_8c8 = local_d08;
      uStack_8c0 = uStack_d00;
      local_8d8 = local_cb8;
      uStack_8d0 = uStack_cb0;
      local_8e8 = local_ca8;
      uStack_8e0 = uStack_ca0;
      local_888 = local_d08;
      uStack_880 = uStack_d00;
      local_898 = local_cb8;
      uStack_890 = uStack_cb0;
      local_8a8 = (local_838 + 0.5) * fVar8 * fVar8;
      fStack_8a4 = (fStack_834 + 0.5) * fVar14 * fVar14;
      fStack_8a0 = (fStack_830 + 0.5) * fVar15 * fVar15;
      fStack_89c = (fStack_82c + 0.5) * fVar18 * fVar18;
      local_8b8 = local_ca8;
      uStack_8b0 = uStack_ca0;
      local_d08 = CONCAT44(fStack_8a4 + fVar14,local_8a8 + fVar8);
      uStack_d00 = CONCAT44(fStack_89c + fVar18,fStack_8a0 + fVar15);
      local_c38 = local_d08;
      uStack_c30 = uStack_d00;
      local_c48 = 0x3f8000003f800000;
      uStack_c40 = 0x3f8000003f800000;
      fVar8 = local_8a8 + fVar8 + 1.0;
      fVar14 = fStack_8a4 + fVar14 + 1.0;
      fVar15 = fStack_8a0 + fVar15 + 1.0;
      fVar18 = fStack_89c + fVar18 + 1.0;
      local_d08 = CONCAT44(fVar14,fVar8);
      uStack_d00 = CONCAT44(fVar18,fVar15);
      local_78 = CONCAT44(fStack_cc4,local_cc8);
      uStack_70 = CONCAT44(fStack_cbc,fStack_cc0);
      local_48 = CONCAT44((int)fStack_cc4,(int)local_cc8);
      uStack_40 = CONCAT44((int)fStack_cbc,(int)fStack_cc0);
      local_a08 = 0x7f0000007f;
      uStack_a00 = 0x7f0000007f;
      iVar19 = (int)local_cc8 + 0x7f;
      fStack_cd4 = (float)((int)fStack_cc4 + 0x7f);
      fStack_cd0 = (float)((int)fStack_cc0 + 0x7f);
      fStack_ccc = (float)((int)fStack_cbc + 0x7f);
      local_28 = CONCAT44(fStack_cd4,iVar19);
      uStack_20 = CONCAT44(fStack_ccc,fStack_cd0);
      local_2c = 0x17;
      local_cd8 = (float)(iVar19 * 0x800000);
      local_d18 = CONCAT44(fStack_cd4,local_cd8);
      uStack_d10 = CONCAT44(fStack_ccc,fStack_cd0);
      local_998 = local_d08;
      uStack_990 = uStack_d00;
      fVar8 = fVar8 * local_cd8;
      fVar14 = fVar14 * fStack_cd4;
      fVar15 = fVar15 * fStack_cd0;
      fVar18 = fVar18 * fStack_ccc;
      local_d08 = CONCAT44(fVar14,fVar8);
      uStack_d00 = CONCAT44(fVar18,fVar15);
      local_d38 = local_d08;
      uStack_d30 = uStack_d00;
      fVar8 = fVar8 + 1.0;
      fVar14 = fVar14 + 1.0;
      fVar15 = fVar15 + 1.0;
      fVar18 = fVar18 + 1.0;
      local_e38 = CONCAT44(fVar14,fVar8);
      uStack_e30._0_4_ = fVar15;
      uStack_e30._4_4_ = fVar18;
      local_ac8 = local_e38;
      uStack_ac0 = uStack_e30;
      local_e28 = 0;
      uStack_e20 = 0;
      local_ad8 = 0;
      uStack_ad0 = 0;
      local_e68 = -(uint)(fVar8 <= 0.0);
      iStack_e64 = -(uint)(fVar14 <= 0.0);
      iStack_e60 = -(uint)(fVar15 <= 0.0);
      iStack_e5c = -(uint)(fVar18 <= 0.0);
      local_a88 = local_e38;
      uStack_a80 = uStack_e30;
      local_a98 = 0x80000000800000;
      uStack_a90 = 0x80000000800000;
      auVar5._8_8_ = uStack_e30;
      auVar5._0_8_ = local_e38;
      auVar12._8_8_ = 0x80000000800000;
      auVar12._0_8_ = 0x80000000800000;
      auVar13 = maxps(auVar5,auVar12);
      local_e38 = auVar13._0_8_;
      local_a58 = local_e38;
      uStack_e30 = auVar13._8_8_;
      uStack_a50 = uStack_e30;
      uVar3 = local_e38;
      uVar4 = uStack_e30;
      local_a6c = 0x17;
      local_a68._0_4_ = auVar13._0_4_;
      local_a68._4_4_ = auVar13._4_4_;
      uStack_a60._0_4_ = auVar13._8_4_;
      uStack_a60._4_4_ = auVar13._12_4_;
      local_dc8 = local_e38;
      uStack_dc0 = uStack_e30;
      local_dd8 = 0x807fffff807fffff;
      uStack_dd0 = 0x807fffff807fffff;
      local_a18 = local_e38 & 0x807fffff807fffff;
      uStack_a10 = uStack_e30 & 0x807fffff807fffff;
      local_de8 = local_a18 | 0x3f0000003f000000;
      uStack_de0 = uStack_a10 | 0x3f0000003f000000;
      local_9f8 = CONCAT44(local_a68._4_4_ >> 0x17,(uint)local_a68 >> 0x17);
      uStack_9f0 = CONCAT44(uStack_a60._4_4_ >> 0x17,(uint)uStack_a60 >> 0x17);
      local_e48 = ((uint)local_a68 >> 0x17) - 0x7f;
      iStack_e44 = (local_a68._4_4_ >> 0x17) - 0x7f;
      iStack_e40 = ((uint)uStack_a60 >> 0x17) - 0x7f;
      iStack_e3c = (uStack_a60._4_4_ >> 0x17) - 0x7f;
      local_9d8 = CONCAT44(iStack_e44,local_e48);
      uStack_9d0 = CONCAT44(iStack_e3c,iStack_e40);
      local_d68 = CONCAT44((float)iStack_e44,(float)local_e48);
      uStack_d60 = CONCAT44((float)iStack_e3c,(float)iStack_e40);
      local_d78 = 0x3f8000003f800000;
      uStack_d70 = 0x3f8000003f800000;
      local_e78 = (float)local_e48 + 1.0;
      fStack_e74 = (float)iStack_e44 + 1.0;
      fStack_e70 = (float)iStack_e40 + 1.0;
      fStack_e6c = (float)iStack_e3c + 1.0;
      local_9c8 = 0x3f3504f33f3504f3;
      uStack_9c0 = 0x3f3504f33f3504f3;
      local_9b8._0_4_ = (float)local_de8;
      local_9b8._4_4_ = (float)(local_de8 >> 0x20);
      uStack_9b0._0_4_ = (float)uStack_de0;
      uStack_9b0._4_4_ = (float)(uStack_de0 >> 0x20);
      local_e88 = -(uint)((float)local_9b8 < 0.70710677);
      iStack_e84 = -(uint)(local_9b8._4_4_ < 0.70710677);
      iStack_e80 = -(uint)((float)uStack_9b0 < 0.70710677);
      iStack_e7c = -(uint)(uStack_9b0._4_4_ < 0.70710677);
      local_df8 = CONCAT44(iStack_e84,local_e88);
      uStack_df0 = CONCAT44(iStack_e7c,iStack_e80);
      local_e98 = local_de8 & local_df8;
      uStack_e90 = uStack_de0 & uStack_df0;
      local_bc8 = 0x3f8000003f800000;
      uStack_bc0 = 0x3f8000003f800000;
      local_e38 = CONCAT44(local_9b8._4_4_ - 1.0,(float)local_9b8 - 1.0);
      uStack_e30._0_4_ = (float)uStack_9b0 - 1.0;
      uStack_e30._4_4_ = uStack_9b0._4_4_ - 1.0;
      local_bd8 = CONCAT44(fStack_e74,local_e78);
      uStack_bd0 = CONCAT44(fStack_e6c,fStack_e70);
      local_e08 = 0x3f8000003f800000;
      uStack_e00 = 0x3f8000003f800000;
      local_e18 = CONCAT44(iStack_e84,local_e88);
      uStack_e10 = CONCAT44(iStack_e7c,iStack_e80);
      uVar10 = local_e18 & 0x3f8000003f800000;
      uVar17 = uStack_e10 & 0x3f8000003f800000;
      local_be8._0_4_ = (float)uVar10;
      local_be8._4_4_ = (float)(uVar10 >> 0x20);
      uStack_be0._0_4_ = (float)uVar17;
      uStack_be0._4_4_ = (float)(uVar17 >> 0x20);
      local_e78 = local_e78 - (float)local_be8;
      fStack_e74 = fStack_e74 - local_be8._4_4_;
      fStack_e70 = fStack_e70 - (float)uStack_be0;
      fStack_e6c = fStack_e6c - uStack_be0._4_4_;
      local_d88 = local_e38;
      uStack_d80 = uStack_e30;
      local_d98._0_4_ = (float)local_e98;
      local_d98._4_4_ = (float)(local_e98 >> 0x20);
      uStack_d90._0_4_ = (float)uStack_e90;
      uStack_d90._4_4_ = (float)(uStack_e90 >> 0x20);
      local_d98._0_4_ = ((float)local_9b8 - 1.0) + (float)local_d98;
      local_d98._4_4_ = (local_9b8._4_4_ - 1.0) + local_d98._4_4_;
      uStack_d90._0_4_ = ((float)uStack_9b0 - 1.0) + (float)uStack_d90;
      uStack_d90._4_4_ = (uStack_9b0._4_4_ - 1.0) + uStack_d90._4_4_;
      local_e38 = CONCAT44(local_d98._4_4_,(float)local_d98);
      uStack_e30._0_4_ = (float)uStack_d90;
      uStack_e30._4_4_ = uStack_d90._4_4_;
      local_908 = local_e38;
      uStack_900 = uStack_e30;
      local_ea8 = (float)local_d98 * (float)local_d98;
      fStack_ea4 = local_d98._4_4_ * local_d98._4_4_;
      fStack_ea0 = (float)uStack_d90 * (float)uStack_d90;
      fStack_e9c = uStack_d90._4_4_ * uStack_d90._4_4_;
      local_238 = 0x3d9021bb3d9021bb;
      uStack_230 = 0x3d9021bb3d9021bb;
      local_248 = local_e38;
      uStack_240 = uStack_e30;
      local_258 = 0xbdebd1b8bdebd1b8;
      uStack_250 = 0xbdebd1b8bdebd1b8;
      local_1f8 = 0x3d9021bb3d9021bb;
      uStack_1f0 = 0x3d9021bb3d9021bb;
      local_208 = local_e38;
      uStack_200 = uStack_e30;
      local_218 = (float)local_d98 * 0.070376836;
      fStack_214 = local_d98._4_4_ * 0.070376836;
      fStack_210 = (float)uStack_d90 * 0.070376836;
      fStack_20c = uStack_d90._4_4_ * 0.070376836;
      local_228 = 0xbdebd1b8bdebd1b8;
      uStack_220 = 0xbdebd1b8bdebd1b8;
      local_eb8 = CONCAT44(fStack_214 + -0.1151461,local_218 + -0.1151461);
      uStack_eb0 = CONCAT44(fStack_20c + -0.1151461,fStack_210 + -0.1151461);
      local_2a8 = local_eb8;
      uStack_2a0 = uStack_eb0;
      local_2b8 = local_e38;
      uStack_2b0 = uStack_e30;
      local_2c8 = 0x3def251a3def251a;
      uStack_2c0 = 0x3def251a3def251a;
      local_268 = local_eb8;
      uStack_260 = uStack_eb0;
      local_278 = local_e38;
      uStack_270 = uStack_e30;
      local_288 = (local_218 + -0.1151461) * (float)local_d98;
      fStack_284 = (fStack_214 + -0.1151461) * local_d98._4_4_;
      fStack_280 = (fStack_210 + -0.1151461) * (float)uStack_d90;
      fStack_27c = (fStack_20c + -0.1151461) * uStack_d90._4_4_;
      local_298 = 0x3def251a3def251a;
      uStack_290 = 0x3def251a3def251a;
      local_eb8 = CONCAT44(fStack_284 + 0.116769984,local_288 + 0.116769984);
      uStack_eb0 = CONCAT44(fStack_27c + 0.116769984,fStack_280 + 0.116769984);
      local_318 = local_eb8;
      uStack_310 = uStack_eb0;
      local_328 = local_e38;
      uStack_320 = uStack_e30;
      local_338 = 0xbdfe5d4fbdfe5d4f;
      uStack_330 = 0xbdfe5d4fbdfe5d4f;
      local_2d8 = local_eb8;
      uStack_2d0 = uStack_eb0;
      local_2e8 = local_e38;
      uStack_2e0 = uStack_e30;
      local_2f8 = (local_288 + 0.116769984) * (float)local_d98;
      fStack_2f4 = (fStack_284 + 0.116769984) * local_d98._4_4_;
      fStack_2f0 = (fStack_280 + 0.116769984) * (float)uStack_d90;
      fStack_2ec = (fStack_27c + 0.116769984) * uStack_d90._4_4_;
      local_308 = 0xbdfe5d4fbdfe5d4f;
      uStack_300 = 0xbdfe5d4fbdfe5d4f;
      local_eb8 = CONCAT44(fStack_2f4 + -0.12420141,local_2f8 + -0.12420141);
      uStack_eb0 = CONCAT44(fStack_2ec + -0.12420141,fStack_2f0 + -0.12420141);
      local_388 = local_eb8;
      uStack_380 = uStack_eb0;
      local_398 = local_e38;
      uStack_390 = uStack_e30;
      local_3a8 = 0x3e11e9bf3e11e9bf;
      uStack_3a0 = 0x3e11e9bf3e11e9bf;
      local_348 = local_eb8;
      uStack_340 = uStack_eb0;
      local_358 = local_e38;
      uStack_350 = uStack_e30;
      local_368 = (local_2f8 + -0.12420141) * (float)local_d98;
      fStack_364 = (fStack_2f4 + -0.12420141) * local_d98._4_4_;
      fStack_360 = (fStack_2f0 + -0.12420141) * (float)uStack_d90;
      fStack_35c = (fStack_2ec + -0.12420141) * uStack_d90._4_4_;
      local_378 = 0x3e11e9bf3e11e9bf;
      uStack_370 = 0x3e11e9bf3e11e9bf;
      local_eb8 = CONCAT44(fStack_364 + 0.14249323,local_368 + 0.14249323);
      uStack_eb0 = CONCAT44(fStack_35c + 0.14249323,fStack_360 + 0.14249323);
      local_3f8 = local_eb8;
      uStack_3f0 = uStack_eb0;
      local_408 = local_e38;
      uStack_400 = uStack_e30;
      local_418 = 0xbe2aae50be2aae50;
      uStack_410 = 0xbe2aae50be2aae50;
      local_3b8 = local_eb8;
      uStack_3b0 = uStack_eb0;
      local_3c8 = local_e38;
      uStack_3c0 = uStack_e30;
      local_3d8 = (local_368 + 0.14249323) * (float)local_d98;
      fStack_3d4 = (fStack_364 + 0.14249323) * local_d98._4_4_;
      fStack_3d0 = (fStack_360 + 0.14249323) * (float)uStack_d90;
      fStack_3cc = (fStack_35c + 0.14249323) * uStack_d90._4_4_;
      local_3e8 = 0xbe2aae50be2aae50;
      uStack_3e0 = 0xbe2aae50be2aae50;
      local_eb8 = CONCAT44(fStack_3d4 + -0.16668057,local_3d8 + -0.16668057);
      uStack_eb0 = CONCAT44(fStack_3cc + -0.16668057,fStack_3d0 + -0.16668057);
      local_468 = local_eb8;
      uStack_460 = uStack_eb0;
      local_478 = local_e38;
      uStack_470 = uStack_e30;
      local_488 = 0x3e4cceac3e4cceac;
      uStack_480 = 0x3e4cceac3e4cceac;
      local_428 = local_eb8;
      uStack_420 = uStack_eb0;
      local_438 = local_e38;
      uStack_430 = uStack_e30;
      local_448 = (local_3d8 + -0.16668057) * (float)local_d98;
      fStack_444 = (fStack_3d4 + -0.16668057) * local_d98._4_4_;
      fStack_440 = (fStack_3d0 + -0.16668057) * (float)uStack_d90;
      fStack_43c = (fStack_3cc + -0.16668057) * uStack_d90._4_4_;
      local_458 = 0x3e4cceac3e4cceac;
      uStack_450 = 0x3e4cceac3e4cceac;
      local_eb8 = CONCAT44(fStack_444 + 0.20000714,local_448 + 0.20000714);
      uStack_eb0 = CONCAT44(fStack_43c + 0.20000714,fStack_440 + 0.20000714);
      local_4d8 = local_eb8;
      uStack_4d0 = uStack_eb0;
      local_4e8 = local_e38;
      uStack_4e0 = uStack_e30;
      local_4f8 = 0xbe7ffffcbe7ffffc;
      uStack_4f0 = 0xbe7ffffcbe7ffffc;
      local_498 = local_eb8;
      uStack_490 = uStack_eb0;
      local_4a8 = local_e38;
      uStack_4a0 = uStack_e30;
      local_4b8 = (local_448 + 0.20000714) * (float)local_d98;
      fStack_4b4 = (fStack_444 + 0.20000714) * local_d98._4_4_;
      fStack_4b0 = (fStack_440 + 0.20000714) * (float)uStack_d90;
      fStack_4ac = (fStack_43c + 0.20000714) * uStack_d90._4_4_;
      local_4c8 = 0xbe7ffffcbe7ffffc;
      uStack_4c0 = 0xbe7ffffcbe7ffffc;
      local_eb8 = CONCAT44(fStack_4b4 + -0.24999994,local_4b8 + -0.24999994);
      uStack_eb0 = CONCAT44(fStack_4ac + -0.24999994,fStack_4b0 + -0.24999994);
      local_548 = local_eb8;
      uStack_540 = uStack_eb0;
      local_558 = local_e38;
      uStack_550 = uStack_e30;
      local_568 = 0x3eaaaaaa3eaaaaaa;
      uStack_560 = 0x3eaaaaaa3eaaaaaa;
      local_508 = local_eb8;
      uStack_500 = uStack_eb0;
      local_518 = local_e38;
      uStack_510 = uStack_e30;
      local_528 = (local_4b8 + -0.24999994) * (float)local_d98;
      fStack_524 = (fStack_4b4 + -0.24999994) * local_d98._4_4_;
      fStack_520 = (fStack_4b0 + -0.24999994) * (float)uStack_d90;
      fStack_51c = (fStack_4ac + -0.24999994) * uStack_d90._4_4_;
      local_538 = 0x3eaaaaaa3eaaaaaa;
      uStack_530 = 0x3eaaaaaa3eaaaaaa;
      local_eb8 = CONCAT44(fStack_524 + 0.3333333,local_528 + 0.3333333);
      uStack_eb0 = CONCAT44(fStack_51c + 0.3333333,fStack_520 + 0.3333333);
      local_918 = local_eb8;
      uStack_910 = uStack_eb0;
      local_928 = local_e38;
      uStack_920 = uStack_e30;
      fVar8 = (local_528 + 0.3333333) * (float)local_d98;
      fVar14 = (fStack_524 + 0.3333333) * local_d98._4_4_;
      fVar15 = (fStack_520 + 0.3333333) * (float)uStack_d90;
      fVar18 = (fStack_51c + 0.3333333) * uStack_d90._4_4_;
      local_eb8 = CONCAT44(fVar14,fVar8);
      uStack_eb0 = CONCAT44(fVar18,fVar15);
      local_938 = local_eb8;
      uStack_930 = uStack_eb0;
      local_948 = CONCAT44(fStack_ea4,local_ea8);
      uStack_940 = CONCAT44(fStack_e9c,fStack_ea0);
      fVar8 = fVar8 * local_ea8;
      fVar14 = fVar14 * fStack_ea4;
      fVar15 = fVar15 * fStack_ea0;
      fVar18 = fVar18 * fStack_e9c;
      local_eb8 = CONCAT44(fVar14,fVar8);
      uStack_eb0 = CONCAT44(fVar18,fVar15);
      local_5b8 = CONCAT44(fStack_e74,local_e78);
      uStack_5b0 = CONCAT44(fStack_e6c,fStack_e70);
      local_5d8 = local_eb8;
      uStack_5d0 = uStack_eb0;
      local_588 = 0xb95e8083b95e8083;
      uStack_580 = 0xb95e8083b95e8083;
      local_598 = local_e78 * -0.00021219444;
      fStack_594 = fStack_e74 * -0.00021219444;
      fStack_590 = fStack_e70 * -0.00021219444;
      fStack_58c = fStack_e6c * -0.00021219444;
      local_5a8 = local_eb8;
      uStack_5a0 = uStack_eb0;
      fVar8 = local_598 + fVar8;
      fVar14 = fStack_594 + fVar14;
      fVar15 = fStack_590 + fVar15;
      fVar18 = fStack_58c + fVar18;
      local_eb8 = CONCAT44(fVar14,fVar8);
      uStack_eb0 = CONCAT44(fVar18,fVar15);
      local_e8 = CONCAT44(fStack_ea4,local_ea8);
      uStack_e0 = CONCAT44(fStack_e9c,fStack_ea0);
      local_108 = local_eb8;
      uStack_100 = uStack_eb0;
      local_c8 = local_eb8;
      uStack_c0 = uStack_eb0;
      local_b8 = 0x3f0000003f000000;
      uStack_b0 = 0x3f0000003f000000;
      local_d8 = local_ea8 * 0.5;
      fStack_d4 = fStack_ea4 * 0.5;
      fStack_d0 = fStack_ea0 * 0.5;
      fStack_cc = fStack_e9c * 0.5;
      fVar8 = fVar8 - local_d8;
      fVar14 = fVar14 - fStack_d4;
      fVar15 = fVar15 - fStack_d0;
      fVar18 = fVar18 - fStack_cc;
      local_eb8 = CONCAT44(fVar14,fVar8);
      uStack_eb0 = CONCAT44(fVar18,fVar15);
      local_da8 = local_e38;
      uStack_da0 = uStack_e30;
      local_db8 = local_eb8;
      uStack_db0 = uStack_eb0;
      local_d98._0_4_ = (float)local_d98 + fVar8;
      local_d98._4_4_ = local_d98._4_4_ + fVar14;
      uStack_d90._0_4_ = (float)uStack_d90 + fVar15;
      uStack_d90._4_4_ = uStack_d90._4_4_ + fVar18;
      local_e38 = CONCAT44(local_d98._4_4_,(float)local_d98);
      uStack_e30._0_4_ = (float)uStack_d90;
      uStack_e30._4_4_ = uStack_d90._4_4_;
      local_628 = CONCAT44(fStack_e74,local_e78);
      uStack_620 = CONCAT44(fStack_e6c,fStack_e70);
      local_648 = local_e38;
      uStack_640 = uStack_e30;
      local_5f8 = 0x3f3180003f318000;
      uStack_5f0 = 0x3f3180003f318000;
      local_608 = local_e78 * 0.6933594;
      fStack_604 = fStack_e74 * 0.6933594;
      fStack_600 = fStack_e70 * 0.6933594;
      fStack_5fc = fStack_e6c * 0.6933594;
      local_618 = local_e38;
      uStack_610 = uStack_e30;
      local_e38 = CONCAT44(fStack_604 + local_d98._4_4_,local_608 + (float)local_d98);
      uStack_e30._0_4_ = fStack_600 + (float)uStack_d90;
      uStack_e30._4_4_ = fStack_5fc + uStack_d90._4_4_;
      local_a38 = local_e38;
      uStack_a30 = uStack_e30;
      local_a48 = CONCAT44(iStack_e64,local_e68);
      uStack_a40 = CONCAT44(iStack_e5c,iStack_e60);
      local_e38 = local_e38 | local_a48;
      uStack_e30 = uStack_e30 | uStack_a40;
      local_ef8 = CONCAT44(-(uint)(0.0 < local_f08._4_4_),-(uint)(0.0 < (float)local_f08));
      uStack_ef0 = CONCAT44(-(uint)(0.0 < uStack_f00._4_4_),-(uint)(0.0 < (float)uStack_f00));
      local_1098 = (float)(local_ee8 & local_ef8);
      local_d48 = local_1098;
      fStack_1094 = (float)((local_ee8 & local_ef8) >> 0x20);
      fStack_d44 = fStack_1094;
      fStack_1090 = (float)(uStack_ee0 & uStack_ef0);
      fStack_d40 = fStack_1090;
      fStack_108c = (float)((uStack_ee0 & uStack_ef0) >> 0x20);
      fStack_d3c = fStack_108c;
      local_d58._0_4_ = (float)local_e38;
      local_d58._4_4_ = (float)(local_e38 >> 0x20);
      uStack_d50._0_4_ = (float)uStack_e30;
      uStack_d50._4_4_ = (float)(uStack_e30 >> 0x20);
      local_1058 = CONCAT44(fStack_1094 + local_d58._4_4_,local_1098 + (float)local_d58);
      uStack_1050 = CONCAT44(fStack_108c + uStack_d50._4_4_,fStack_1090 + (float)uStack_d50);
      local_b70 = local_fd0;
      local_b88 = local_1058;
      uStack_b80 = uStack_1050;
      *(undefined8 *)local_fd0 = local_1058;
      *(undefined8 *)(local_fd0 + 2) = uStack_1050;
      local_fd0 = local_fd0 + 4;
      local_f08 = local_ee8;
      uStack_f00 = uStack_ee0;
      local_ec8 = local_ee8;
      uStack_ec0 = uStack_ee0;
      local_d98 = local_e98;
      uStack_d90 = uStack_e90;
      local_d58 = local_e38;
      uStack_d50 = uStack_e30;
      local_d28 = 0x3f8000003f800000;
      uStack_d20 = 0x3f8000003f800000;
      local_ce8 = local_e58;
      uStack_ce0 = uStack_e50;
      local_c08 = local_cf8;
      uStack_c00 = uStack_cf0;
      local_be8 = uVar10;
      uStack_be0 = uVar17;
      local_bb8 = local_de8;
      uStack_bb0 = uStack_de0;
      local_ba8 = uVar9;
      uStack_ba0 = uVar16;
      local_a68 = uVar3;
      uStack_a60 = uVar4;
      local_a28 = local_c28;
      uStack_a20 = uStack_c20;
      local_9b8 = local_de8;
      uStack_9b0 = uStack_de0;
      local_9a8 = local_d18;
      uStack_9a0 = uStack_d10;
      local_978 = local_988;
      uStack_970 = uStack_980;
      local_958 = uVar1;
      uStack_950 = uVar2;
      local_8f8 = local_908;
      uStack_8f0 = uStack_900;
      local_878 = local_c28;
      uStack_870 = uStack_c20;
      local_5e8 = local_628;
      uStack_5e0 = uStack_620;
      local_578 = local_5b8;
      uStack_570 = uStack_5b0;
      local_1d8 = local_5c8;
      uStack_1d0 = uStack_5c0;
      local_188 = local_1c8;
      uStack_180 = uStack_1c0;
      local_168 = local_638;
      uStack_160 = uStack_630;
      local_118 = local_158;
      uStack_110 = uStack_150;
      local_f8 = local_c28;
      uStack_f0 = uStack_c20;
      local_a8 = local_e8;
      uStack_a0 = uStack_e0;
      local_58 = local_a08;
      uStack_50 = uStack_a00;
      local_18 = local_d18;
      uStack_10 = uStack_d10;
    }
    for (; local_1028 < local_fc0; local_1028 = local_1028 + 1) {
      if (*local_fd0 <= 0.0) {
        dVar11 = std::exp((double)(ulong)(uint)*local_fd0);
        dVar11 = std::log((double)(ulong)(uint)(SUB84(dVar11,0) + 1.0));
        *local_fd0 = SUB84(dVar11,0);
      }
      else {
        fVar8 = *local_fd0;
        dVar11 = std::exp((double)(ulong)(uint)-*local_fd0);
        dVar11 = std::log((double)(ulong)(uint)(SUB84(dVar11,0) + 1.0));
        *local_fd0 = fVar8 + SUB84(dVar11,0);
      }
      local_fd0 = local_fd0 + 1;
    }
  }
  return 0;
}

Assistant:

int BNLL_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);
        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        __m512 _zero_avx512 = _mm512_setzero_ps();
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __mmask16 mask = _mm512_cmp_ps_mask(_p, _zero_avx512, _CMP_GT_OQ);
            __m512 _abs_p = _mm512_castsi512_ps(_mm512_and_epi32(_mm512_castps_si512(_p), _mm512_set1_epi32(0x7fffffff)));
            __m512 _tmp = log512_ps(_mm512_add_ps(_one_avx512, exp512_ps(_mm512_sub_ps(_zero_avx512, _abs_p))));
            _p = _mm512_mask_add_ps(_tmp, mask, _tmp, _p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _one_avx = _mm256_set1_ps(1.f);
        __m256 _zero_avx = _mm256_setzero_ps();
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 mask = _mm256_cmp_ps(_p, _mm256_setzero_ps(), _CMP_GT_OQ);
            __m256 _abs_p = _mm256_and_ps(_p, *(__m256*)_ps256_inv_sign_mask);
            __m256 _tmp = log256_ps(_mm256_add_ps(_one_avx, exp256_ps(_mm256_sub_ps(_zero_avx, _abs_p))));
            __m256 _x = _mm256_and_ps(_p, mask);
            _p = _mm256_add_ps(_x, _tmp);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _one = _mm_set1_ps(1.f);
        __m128 _zero = _mm_setzero_ps();
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 mask = _mm_cmpgt_ps(_p, _zero);
            __m128 _abs_p = _mm_and_ps(_p, *(__m128*)_ps_inv_sign_mask);
            __m128 _tmp = log_ps(_mm_add_ps(_one, exp_ps(_mm_sub_ps(_zero, _abs_p))));
            __m128 _x = _mm_and_ps(_p, mask);
            _p = _mm_add_ps(_x, _tmp);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr > 0)
                *ptr = static_cast<float>(*ptr + log(1.f + exp(-(*ptr))));
            else
                *ptr = static_cast<float>(log(1.f + exp(*ptr)));
            ptr++;
        }
    }
    return 0;
}